

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_type.cpp
# Opt level: O0

MetricsType duckdb::MetricsUtils::GetOptimizerMetricByType(OptimizerType type)

{
  undefined8 uVar1;
  undefined4 in_EDI;
  OptimizerType in_stack_ffffffffffffffac;
  allocator local_29;
  string local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  InternalException *in_stack_fffffffffffffff0;
  MetricsType local_1;
  
  switch(in_EDI) {
  case 1:
    local_1 = OPTIMIZER_EXPRESSION_REWRITER;
    break;
  case 2:
    local_1 = OPTIMIZER_FILTER_PULLUP;
    break;
  case 3:
    local_1 = OPTIMIZER_FILTER_PUSHDOWN;
    break;
  case 4:
    local_1 = OPTIMIZER_EMPTY_RESULT_PULLUP;
    break;
  case 5:
    local_1 = OPTIMIZER_CTE_FILTER_PUSHER;
    break;
  case 6:
    local_1 = OPTIMIZER_REGEX_RANGE;
    break;
  case 7:
    local_1 = OPTIMIZER_IN_CLAUSE;
    break;
  case 8:
    local_1 = OPTIMIZER_JOIN_ORDER;
    break;
  case 9:
    local_1 = OPTIMIZER_DELIMINATOR;
    break;
  case 10:
    local_1 = OPTIMIZER_UNNEST_REWRITER;
    break;
  case 0xb:
    local_1 = OPTIMIZER_UNUSED_COLUMNS;
    break;
  case 0xc:
    local_1 = OPTIMIZER_STATISTICS_PROPAGATION;
    break;
  case 0xd:
    local_1 = OPTIMIZER_COMMON_SUBEXPRESSIONS;
    break;
  case 0xe:
    local_1 = OPTIMIZER_COMMON_AGGREGATE;
    break;
  case 0xf:
    local_1 = OPTIMIZER_COLUMN_LIFETIME;
    break;
  case 0x10:
    local_1 = OPTIMIZER_BUILD_SIDE_PROBE_SIDE;
    break;
  case 0x11:
    local_1 = OPTIMIZER_LIMIT_PUSHDOWN;
    break;
  case 0x12:
    local_1 = OPTIMIZER_TOP_N;
    break;
  case 0x13:
    local_1 = OPTIMIZER_COMPRESSED_MATERIALIZATION;
    break;
  case 0x14:
    local_1 = OPTIMIZER_DUPLICATE_GROUPS;
    break;
  case 0x15:
    local_1 = OPTIMIZER_REORDER_FILTER;
    break;
  case 0x16:
    local_1 = OPTIMIZER_SAMPLING_PUSHDOWN;
    break;
  case 0x17:
    local_1 = OPTIMIZER_JOIN_FILTER_PUSHDOWN;
    break;
  case 0x18:
    local_1 = OPTIMIZER_EXTENSION;
    break;
  case 0x19:
    local_1 = OPTIMIZER_MATERIALIZED_CTE;
    break;
  case 0x1a:
    local_1 = OPTIMIZER_SUM_REWRITER;
    break;
  case 0x1b:
    local_1 = OPTIMIZER_LATE_MATERIALIZATION;
    break;
  default:
    uVar1 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_28,"OptimizerType %s cannot be converted to a MetricsType",&local_29);
    EnumUtil::ToString<duckdb::OptimizerType>(in_stack_ffffffffffffffac);
    InternalException::
    InternalException<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    __cxa_throw(uVar1,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return local_1;
}

Assistant:

MetricsType MetricsUtils::GetOptimizerMetricByType(OptimizerType type) {
    switch(type) {
        case OptimizerType::EXPRESSION_REWRITER:
            return MetricsType::OPTIMIZER_EXPRESSION_REWRITER;
        case OptimizerType::FILTER_PULLUP:
            return MetricsType::OPTIMIZER_FILTER_PULLUP;
        case OptimizerType::FILTER_PUSHDOWN:
            return MetricsType::OPTIMIZER_FILTER_PUSHDOWN;
        case OptimizerType::EMPTY_RESULT_PULLUP:
            return MetricsType::OPTIMIZER_EMPTY_RESULT_PULLUP;
        case OptimizerType::CTE_FILTER_PUSHER:
            return MetricsType::OPTIMIZER_CTE_FILTER_PUSHER;
        case OptimizerType::REGEX_RANGE:
            return MetricsType::OPTIMIZER_REGEX_RANGE;
        case OptimizerType::IN_CLAUSE:
            return MetricsType::OPTIMIZER_IN_CLAUSE;
        case OptimizerType::JOIN_ORDER:
            return MetricsType::OPTIMIZER_JOIN_ORDER;
        case OptimizerType::DELIMINATOR:
            return MetricsType::OPTIMIZER_DELIMINATOR;
        case OptimizerType::UNNEST_REWRITER:
            return MetricsType::OPTIMIZER_UNNEST_REWRITER;
        case OptimizerType::UNUSED_COLUMNS:
            return MetricsType::OPTIMIZER_UNUSED_COLUMNS;
        case OptimizerType::STATISTICS_PROPAGATION:
            return MetricsType::OPTIMIZER_STATISTICS_PROPAGATION;
        case OptimizerType::COMMON_SUBEXPRESSIONS:
            return MetricsType::OPTIMIZER_COMMON_SUBEXPRESSIONS;
        case OptimizerType::COMMON_AGGREGATE:
            return MetricsType::OPTIMIZER_COMMON_AGGREGATE;
        case OptimizerType::COLUMN_LIFETIME:
            return MetricsType::OPTIMIZER_COLUMN_LIFETIME;
        case OptimizerType::BUILD_SIDE_PROBE_SIDE:
            return MetricsType::OPTIMIZER_BUILD_SIDE_PROBE_SIDE;
        case OptimizerType::LIMIT_PUSHDOWN:
            return MetricsType::OPTIMIZER_LIMIT_PUSHDOWN;
        case OptimizerType::TOP_N:
            return MetricsType::OPTIMIZER_TOP_N;
        case OptimizerType::COMPRESSED_MATERIALIZATION:
            return MetricsType::OPTIMIZER_COMPRESSED_MATERIALIZATION;
        case OptimizerType::DUPLICATE_GROUPS:
            return MetricsType::OPTIMIZER_DUPLICATE_GROUPS;
        case OptimizerType::REORDER_FILTER:
            return MetricsType::OPTIMIZER_REORDER_FILTER;
        case OptimizerType::SAMPLING_PUSHDOWN:
            return MetricsType::OPTIMIZER_SAMPLING_PUSHDOWN;
        case OptimizerType::JOIN_FILTER_PUSHDOWN:
            return MetricsType::OPTIMIZER_JOIN_FILTER_PUSHDOWN;
        case OptimizerType::EXTENSION:
            return MetricsType::OPTIMIZER_EXTENSION;
        case OptimizerType::MATERIALIZED_CTE:
            return MetricsType::OPTIMIZER_MATERIALIZED_CTE;
        case OptimizerType::SUM_REWRITER:
            return MetricsType::OPTIMIZER_SUM_REWRITER;
        case OptimizerType::LATE_MATERIALIZATION:
            return MetricsType::OPTIMIZER_LATE_MATERIALIZATION;
       default:
            throw InternalException("OptimizerType %s cannot be converted to a MetricsType", EnumUtil::ToString(type));
    };
}